

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O2

void __thiscall Analysis::UpdateParameterDict(Analysis *this,string *param_filename)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)param_filename);
  ParameterReader::readFromFile(&this->paraRdr_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  ParameterReader::echo(&this->paraRdr_);
  return;
}

Assistant:

void Analysis::UpdateParameterDict(std::string param_filename) {
    paraRdr_.readFromFile(param_filename);
    paraRdr_.echo();
}